

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modm-donna-64bit.h
# Opt level: O0

void reduce256_modm(bignum256modm_element_t *r)

{
  bignum256modm_element_t bVar1;
  bignum256modm_element_t bVar2;
  bignum256modm_element_t bVar3;
  bignum256modm_element_t bVar4;
  bignum256modm_element_t bVar5;
  bignum256modm_element_t bVar6;
  bignum256modm_element_t b_00;
  bignum256modm_element_t bVar7;
  bignum256modm_element_t bVar8;
  ulong uVar9;
  bignum256modm_element_t mask;
  bignum256modm_element_t pb;
  bignum256modm_element_t b;
  bignum256modm t;
  bignum256modm_element_t *r_local;
  
  bVar5 = lt_modm(*r,0x12631a5cf5d3ed);
  bVar1 = *r;
  bVar6 = lt_modm(r[1],bVar5 + 0xf9dea2f79cd658);
  bVar2 = r[1];
  b_00 = lt_modm(r[2],bVar6 + 0x14de);
  bVar3 = r[2];
  bVar7 = lt_modm(r[3],b_00);
  bVar4 = r[3];
  bVar8 = lt_modm(r[4],bVar7 + 0x10000000);
  uVar9 = bVar8 - 1;
  *r = uVar9 & (*r ^ bVar1 + 0xffed9ce5a30a2c13 + (bVar5 << 0x38)) ^ *r;
  r[1] = uVar9 & (r[1] ^ (bVar2 - (bVar5 + 0xf9dea2f79cd658)) + (bVar6 << 0x38)) ^ r[1];
  r[2] = uVar9 & (r[2] ^ (bVar3 - (bVar6 + 0x14de)) + (b_00 << 0x38)) ^ r[2];
  r[3] = uVar9 & (r[3] ^ (bVar4 - b_00) + (bVar7 << 0x38)) ^ r[3];
  r[4] = uVar9 & (r[4] ^ (r[4] - (bVar7 + 0x10000000)) + (bVar8 << 0x20)) ^ r[4];
  return;
}

Assistant:

static void
reduce256_modm(bignum256modm r) {
	bignum256modm t;
	bignum256modm_element_t b = 0, pb, mask;

	/* t = r - m */
	pb = 0;
	pb += modm_m[0]; b = lt_modm(r[0], pb); t[0] = (r[0] - pb + (b << 56)); pb = b;
	pb += modm_m[1]; b = lt_modm(r[1], pb); t[1] = (r[1] - pb + (b << 56)); pb = b;
	pb += modm_m[2]; b = lt_modm(r[2], pb); t[2] = (r[2] - pb + (b << 56)); pb = b;
	pb += modm_m[3]; b = lt_modm(r[3], pb); t[3] = (r[3] - pb + (b << 56)); pb = b;
	pb += modm_m[4]; b = lt_modm(r[4], pb); t[4] = (r[4] - pb + (b << 32)); 

	/* keep r if r was smaller than m */
	mask = b - 1;

	r[0] ^= mask & (r[0] ^ t[0]);
	r[1] ^= mask & (r[1] ^ t[1]);
	r[2] ^= mask & (r[2] ^ t[2]);
	r[3] ^= mask & (r[3] ^ t[3]);
	r[4] ^= mask & (r[4] ^ t[4]);
}